

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GhostTorsion.cpp
# Opt level: O3

void __thiscall
OpenMD::GhostTorsion::calcForce(GhostTorsion *this,RealType *angle,bool doParticlePot)

{
  RealType *pRVar1;
  pointer ppAVar2;
  Atom *this_00;
  Atom *pAVar3;
  TorsionType *pTVar4;
  DataStoragePointer DVar5;
  Snapshot *pSVar6;
  DataStoragePointer DVar7;
  Snapshot *pSVar8;
  DataStoragePointer DVar9;
  Snapshot *pSVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  uint i;
  long lVar19;
  double *pdVar20;
  long lVar21;
  double *pdVar22;
  uint i_18;
  long lVar23;
  uint i_21;
  uint i_20;
  long lVar24;
  double (*__return_storage_ptr__) [3];
  uint i_22;
  uint i_23;
  long lVar25;
  double tmp;
  double tmp_1;
  Vector<double,_3U> v;
  Vector<double,_3U> result_5;
  Vector<double,_3U> result_6;
  Vector<double,_3U> result_18;
  Vector<double,_3U> result_16;
  Vector<double,_3U> result;
  RealType dVdcosPhi;
  Vector<double,_3U> result_12;
  Vector<double,_3U> result_19;
  Vector3<double> result_4;
  double local_298 [4];
  double local_278 [4];
  double local_258 [4];
  double local_238;
  double local_230;
  double local_228 [4];
  double local_208 [4];
  Vector3d local_1e8;
  double local_1c8 [10];
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double local_150 [5];
  Vector3d local_128;
  double local_108;
  undefined8 uStack_100;
  double local_f8 [4];
  double local_d8 [4];
  double local_b8 [10];
  double local_68 [4];
  double local_48 [3];
  
  ppAVar2 = (this->super_Torsion).super_ShortRangeInteraction.atoms_.
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = ppAVar2[2];
  pAVar3 = *ppAVar2;
  lVar21 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar19 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_48[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar21 * 0x18);
  pdVar20 = (double *)(lVar19 + lVar21 * 0x18);
  local_48[0] = *pdVar20;
  local_48[1] = pdVar20[1];
  pAVar3 = ppAVar2[1];
  lVar21 = (long)(pAVar3->super_StuntDouble).localIndex_;
  lVar19 = *(long *)((long)&(((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData)
                            .position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (pAVar3->super_StuntDouble).storage_);
  local_d8[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar21 * 0x18);
  pdVar20 = (double *)(lVar19 + lVar21 * 0x18);
  local_d8[0] = *pdVar20;
  local_d8[1] = pdVar20[1];
  lVar21 = (long)(this_00->super_StuntDouble).localIndex_;
  lVar19 = *(long *)((long)&(((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_->atomData
                            ).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                    (this_00->super_StuntDouble).storage_);
  local_68[2] = (double)*(undefined8 *)(lVar19 + 0x10 + lVar21 * 0x18);
  pdVar20 = (double *)(lVar19 + lVar21 * 0x18);
  local_68[0] = *pdVar20;
  local_68[1] = pdVar20[1];
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  lVar19 = 0;
  do {
    local_1c8[lVar19] = local_48[lVar19] - local_d8[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  local_128.super_Vector<double,_3U>.data_[2] = local_1c8[2];
  local_128.super_Vector<double,_3U>.data_[0] = local_1c8[0];
  local_128.super_Vector<double,_3U>.data_[1] = local_1c8[1];
  Snapshot::wrapVector
            (((this->super_Torsion).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             &local_128);
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[2] = 0.0;
  lVar19 = 0;
  do {
    local_1c8[lVar19] = local_d8[lVar19] - local_68[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  pdVar20 = local_1c8;
  local_1e8.super_Vector<double,_3U>.data_[2] = local_1c8[2];
  local_1e8.super_Vector<double,_3U>.data_[0] = local_1c8[0];
  local_1e8.super_Vector<double,_3U>.data_[1] = local_1c8[1];
  Snapshot::wrapVector
            (((this->super_Torsion).super_ShortRangeInteraction.snapshotMan_)->currentSnapshot_,
             &local_1e8);
  __return_storage_ptr__ = (double (*) [3])local_b8;
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,&this_00->super_StuntDouble);
  local_1c8[6] = 0.0;
  local_1c8[7] = 0.0;
  local_1c8[4] = 0.0;
  local_1c8[5] = 0.0;
  local_1c8[2] = 0.0;
  local_1c8[3] = 0.0;
  local_1c8[0] = 0.0;
  local_1c8[1] = 0.0;
  local_1c8[8] = 0.0;
  lVar19 = 0;
  do {
    lVar21 = 0;
    pdVar22 = pdVar20;
    do {
      *pdVar22 = (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                 super_RectMatrix<double,_3U,_3U>).data_[0][lVar21];
      lVar21 = lVar21 + 1;
      pdVar22 = pdVar22 + 3;
    } while (lVar21 != 3);
    lVar19 = lVar19 + 1;
    pdVar20 = pdVar20 + 1;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar19 != 3);
  local_298[0] = 0.0;
  local_298[1] = 0.0;
  local_298[2] = 0.0;
  pdVar20 = local_1c8 + 2;
  lVar19 = 0;
  do {
    local_298[lVar19] = *pdVar20;
    lVar19 = lVar19 + 1;
    pdVar20 = pdVar20 + 3;
  } while (lVar19 != 3);
  local_168 = local_298[1];
  dStack_160 = local_298[2];
  local_1c8[0] = local_1e8.super_Vector<double,_3U>.data_[2] *
                 local_128.super_Vector<double,_3U>.data_[1] -
                 local_128.super_Vector<double,_3U>.data_[2] *
                 local_1e8.super_Vector<double,_3U>.data_[1];
  local_1c8[1] = local_1e8.super_Vector<double,_3U>.data_[0] *
                 local_128.super_Vector<double,_3U>.data_[2] -
                 local_128.super_Vector<double,_3U>.data_[0] *
                 local_1e8.super_Vector<double,_3U>.data_[2];
  local_1c8[2] = local_128.super_Vector<double,_3U>.data_[0] *
                 local_1e8.super_Vector<double,_3U>.data_[1] -
                 local_1e8.super_Vector<double,_3U>.data_[0] *
                 local_128.super_Vector<double,_3U>.data_[1];
  local_230 = 0.0;
  lVar19 = 0;
  do {
    local_230 = local_230 + local_1c8[lVar19] * local_1c8[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  local_108 = local_298[0];
  uStack_100 = 0;
  if (local_230 < 0.0) {
    local_230 = sqrt(local_230);
  }
  else {
    local_230 = SQRT(local_230);
  }
  local_158 = 0.0;
  local_178 = dStack_160;
  dStack_170 = local_108;
  local_b8[0] = local_1e8.super_Vector<double,_3U>.data_[1] * dStack_160 -
                local_1e8.super_Vector<double,_3U>.data_[2] * local_168;
  local_b8[1] = local_1e8.super_Vector<double,_3U>.data_[2] * local_108 -
                local_1e8.super_Vector<double,_3U>.data_[0] * dStack_160;
  local_b8[2] = local_1e8.super_Vector<double,_3U>.data_[0] * local_168 -
                local_108 * local_1e8.super_Vector<double,_3U>.data_[1];
  lVar19 = 0;
  do {
    local_158 = local_158 + local_b8[lVar19] * local_b8[lVar19];
    lVar19 = lVar19 + 1;
  } while (lVar19 != 3);
  if (local_158 < 0.0) {
    local_158 = sqrt(local_158);
  }
  else {
    local_158 = SQRT(local_158);
  }
  if (1e-06 <= local_230 * local_158) {
    dVar11 = 0.0;
    lVar19 = 0;
    do {
      dVar11 = dVar11 + local_1c8[lVar19] * local_1c8[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar19 = 0;
    do {
      local_1c8[lVar19] = local_1c8[lVar19] / dVar11;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    dVar11 = 0.0;
    lVar19 = 0;
    do {
      dVar11 = dVar11 + local_b8[lVar19] * local_b8[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    if (dVar11 < 0.0) {
      dVar11 = sqrt(dVar11);
    }
    else {
      dVar11 = SQRT(dVar11);
    }
    lVar19 = 0;
    do {
      local_b8[lVar19] = local_b8[lVar19] / dVar11;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_238 = 0.0;
    lVar19 = 0;
    do {
      local_238 = local_238 + local_1c8[lVar19] * local_b8[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    pTVar4 = (this->super_Torsion).torsionType_;
    pRVar1 = &(this->super_Torsion).potential_;
    (*pTVar4->_vptr_TorsionType[2])(pTVar4,pRVar1,local_150);
    local_278[0] = 0.0;
    local_278[1] = 0.0;
    local_278[2] = 0.0;
    lVar19 = 0;
    do {
      local_278[lVar19] = local_1c8[lVar19] * local_238;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_258[0] = 0.0;
    local_258[1] = 0.0;
    local_258[2] = 0.0;
    lVar19 = 0;
    do {
      local_258[lVar19] = local_278[lVar19] - local_b8[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_298[0] = 0.0;
    local_298[1] = 0.0;
    local_298[2] = 0.0;
    lVar19 = 0;
    do {
      local_298[lVar19] = local_258[lVar19] / local_230;
      dVar17 = local_298[2];
      dVar15 = local_298[1];
      dVar11 = local_298[0];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_278[0] = 0.0;
    local_278[1] = 0.0;
    local_278[2] = 0.0;
    lVar19 = 0;
    do {
      local_278[lVar19] = local_b8[lVar19] * local_238;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_258[0] = 0.0;
    local_258[1] = 0.0;
    local_258[2] = 0.0;
    lVar19 = 0;
    do {
      local_258[lVar19] = local_278[lVar19] - local_1c8[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_298[0] = 0.0;
    local_298[1] = 0.0;
    local_298[2] = 0.0;
    lVar19 = 0;
    do {
      local_298[lVar19] = local_258[lVar19] / local_158;
      dVar18 = local_298[2];
      dVar16 = local_298[1];
      dVar14 = local_298[0];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_298[0] = local_1e8.super_Vector<double,_3U>.data_[1] * dVar17 -
                   dVar15 * local_1e8.super_Vector<double,_3U>.data_[2];
    local_298[1] = local_1e8.super_Vector<double,_3U>.data_[2] * dVar11 -
                   dVar17 * local_1e8.super_Vector<double,_3U>.data_[0];
    local_298[2] = local_1e8.super_Vector<double,_3U>.data_[0] * dVar15 -
                   dVar11 * local_1e8.super_Vector<double,_3U>.data_[1];
    local_150[1] = 0.0;
    local_150[2] = 0.0;
    local_150[3] = 0.0;
    lVar19 = 0;
    do {
      local_150[lVar19 + 1] = local_298[lVar19] * local_150[0];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    dVar12 = dVar16 * local_178;
    dVar13 = dVar18 * dStack_170;
    local_178 = -local_178;
    dStack_170 = -dStack_170;
    local_258[0] = local_168 * dVar18 - dVar12;
    local_258[1] = dStack_160 * dVar14 - dVar13;
    local_258[2] = local_108 * dVar16 - local_168 * dVar14;
    local_278[0] = dVar17 * local_128.super_Vector<double,_3U>.data_[1] -
                   dVar15 * local_128.super_Vector<double,_3U>.data_[2];
    local_278[1] = dVar11 * local_128.super_Vector<double,_3U>.data_[2] -
                   dVar17 * local_128.super_Vector<double,_3U>.data_[0];
    local_278[2] = dVar15 * local_128.super_Vector<double,_3U>.data_[0] -
                   dVar11 * local_128.super_Vector<double,_3U>.data_[1];
    local_298[0] = 0.0;
    local_298[1] = 0.0;
    local_298[2] = 0.0;
    lVar19 = 0;
    do {
      local_298[lVar19] = local_258[lVar19] - local_278[lVar19];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_208[0] = 0.0;
    local_208[1] = 0.0;
    local_208[2] = 0.0;
    lVar19 = 0;
    do {
      local_208[lVar19] = local_298[lVar19] * local_150[0];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    local_298[0] = dVar16 * local_1e8.super_Vector<double,_3U>.data_[2] -
                   local_1e8.super_Vector<double,_3U>.data_[1] * dVar18;
    local_298[1] = dVar18 * local_1e8.super_Vector<double,_3U>.data_[0] -
                   local_1e8.super_Vector<double,_3U>.data_[2] * dVar14;
    local_298[2] = dVar14 * local_1e8.super_Vector<double,_3U>.data_[1] -
                   local_1e8.super_Vector<double,_3U>.data_[0] * dVar16;
    local_228[0] = 0.0;
    local_228[1] = 0.0;
    local_228[2] = 0.0;
    lVar19 = 0;
    do {
      local_228[lVar19] = local_298[lVar19] * local_150[0];
      lVar19 = lVar19 + 1;
    } while (lVar19 != 3);
    ppAVar2 = (this->super_Torsion).super_ShortRangeInteraction.atoms_.
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar3 = *ppAVar2;
    DVar5 = (pAVar3->super_StuntDouble).storage_;
    pSVar6 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar19 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar21 = lVar19 * 0x18 +
             *(long *)((long)&(pSVar6->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar5);
    lVar23 = 0;
    do {
      *(double *)(lVar21 + lVar23 * 8) = local_150[lVar23 + 1] + *(double *)(lVar21 + lVar23 * 8);
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    pAVar3 = ppAVar2[1];
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    local_f8[2] = 0.0;
    lVar21 = 0;
    do {
      local_f8[lVar21] = local_208[lVar21] - local_150[lVar21 + 1];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 3);
    DVar7 = (pAVar3->super_StuntDouble).storage_;
    pSVar8 = ((pAVar3->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar21 = (long)(pAVar3->super_StuntDouble).localIndex_;
    lVar23 = lVar21 * 0x18 +
             *(long *)((long)&(pSVar8->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar7);
    lVar24 = 0;
    do {
      *(double *)(lVar23 + lVar24 * 8) = local_f8[lVar24] + *(double *)(lVar23 + lVar24 * 8);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 3);
    lVar23 = 0;
    do {
      local_208[lVar23] = -local_208[lVar23];
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    DVar9 = (this_00->super_StuntDouble).storage_;
    pSVar10 = ((this_00->super_StuntDouble).snapshotMan_)->currentSnapshot_;
    lVar23 = (long)(this_00->super_StuntDouble).localIndex_;
    lVar25 = *(long *)((long)&(pSVar10->atomData).force.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar9) + lVar23 * 0x18;
    lVar24 = 0;
    do {
      *(double *)(lVar25 + lVar24 * 8) = local_208[lVar24] + *(double *)(lVar25 + lVar24 * 8);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 3);
    lVar24 = 0;
    do {
      local_228[lVar24] = -local_228[lVar24];
      lVar24 = lVar24 + 1;
    } while (lVar24 != 3);
    local_298[0] = local_168 * local_228[2] + local_178 * local_228[1];
    local_298[1] = dStack_160 * local_228[0] + dStack_170 * local_228[2];
    local_298[2] = -local_168 * local_228[0] + local_108 * local_228[1];
    lVar24 = lVar23 * 0x18 +
             *(long *)((long)&(pSVar10->atomData).torque.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + DVar9);
    lVar25 = 0;
    do {
      *(double *)(lVar24 + lVar25 * 8) = local_298[lVar25] + *(double *)(lVar24 + lVar25 * 8);
      lVar25 = lVar25 + 1;
    } while (lVar25 != 3);
    if (doParticlePot) {
      lVar24 = *(long *)((long)&(pSVar6->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar5);
      *(double *)(lVar24 + lVar19 * 8) = *pRVar1 + *(double *)(lVar24 + lVar19 * 8);
      lVar19 = *(long *)((long)&(pSVar8->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar7);
      *(double *)(lVar19 + lVar21 * 8) = *pRVar1 + *(double *)(lVar19 + lVar21 * 8);
      lVar19 = *(long *)((long)&(pSVar10->atomData).particlePot.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_start + DVar9);
      *(double *)(lVar19 + lVar23 * 8) = *pRVar1 + *(double *)(lVar19 + lVar23 * 8);
    }
    dVar11 = acos(local_238);
    *angle = (dVar11 / 3.141592653589793) * 180.0;
  }
  return;
}

Assistant:

void GhostTorsion::calcForce(RealType& angle, bool doParticlePot) {
    DirectionalAtom* ghostAtom = static_cast<DirectionalAtom*>(atoms_[2]);

    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = ghostAtom->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    Vector3d r32 = pos2 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r32);
    Vector3d r43 = ghostAtom->getA().transpose().getColumn(2);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r21, r32);
    RealType rA = A.length();
    Vector3d B  = cross(r32, r43);
    RealType rB = B.length();

    /*
     If either of the two cross product vectors is tiny, that means
     the three atoms involved are colinear, and the torsion angle is
     going to be undefined.  The easiest check for this problem is
     to use the product of the two lengths.
  */
    if (rA * rB < OpenMD::epsilon) return;

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);

    RealType dVdcosPhi;
    torsionType_->calcForce(cos_phi, potential_, dVdcosPhi);

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    Vector3d f1 = dVdcosPhi * cross(r32, dcosdA);
    Vector3d f2 = dVdcosPhi * (cross(r43, dcosdB) - cross(r21, dcosdA));
    Vector3d f3 = dVdcosPhi * cross(dcosdB, r32);

    atoms_[0]->addFrc(f1);
    atoms_[1]->addFrc(f2 - f1);

    ghostAtom->addFrc(-f2);

    f3.negate();
    ghostAtom->addTrq(cross(r43, f3));

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      ghostAtom->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }